

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitArrayGet(BinaryInstWriter *this,ArrayGet *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  uint uVar2;
  HeapType local_48;
  int local_40;
  HeapType local_38;
  HeapType heapType;
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    local_48.id._0_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               (uchar *)&local_48);
  }
  else {
    local_38 = wasm::Type::getHeapType(&curr->ref->type);
    HeapType::getArray(&local_48);
    uVar2 = 0xb;
    if ((CONCAT71(local_48.id._1_7_,(undefined1)local_48.id) == 2) && (local_40 != 0)) {
      uVar2 = curr->signed_ ^ 0xd;
    }
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    heapType.id._4_1_ = 0xfb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)((long)&heapType.id + 4));
    heapType.id._4_4_ = uVar2;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)((long)&heapType.id + 4),(int)this_00,__buf,
               in_RCX);
    WasmBinaryWriter::writeIndexedHeapType(this->parent,local_38);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitArrayGet(ArrayGet* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  const auto& field = heapType.getArray().element;
  int8_t op;
  if (field.type != Type::i32 || field.packedType == Field::not_packed) {
    op = BinaryConsts::ArrayGet;
  } else if (curr->signed_) {
    op = BinaryConsts::ArrayGetS;
  } else {
    op = BinaryConsts::ArrayGetU;
  }
  o << int8_t(BinaryConsts::GCPrefix) << U32LEB(op);
  parent.writeIndexedHeapType(heapType);
}